

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void Imf_2_5::anon_unknown_6::readLineOffsets
               (IStream *is,LineOrder lineOrder,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *lineOffsets,bool *complete)

{
  size_type sVar1;
  ulong uVar2;
  reference pvVar3;
  undefined1 *in_RCX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000010;
  LineOrder in_stack_0000001c;
  uint i_1;
  uint i;
  unsigned_long *in_stack_ffffffffffffffb8;
  IStream *in_stack_ffffffffffffffc0;
  uint local_28;
  uint local_24;
  
  for (local_24 = 0;
      sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDX),
      local_24 < sVar1; local_24 = local_24 + 1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDX,(ulong)local_24);
    Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  *in_RCX = 1;
  local_28 = 0;
  while( true ) {
    uVar2 = (ulong)local_28;
    sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDX);
    if (sVar1 <= uVar2) {
      return;
    }
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_RDX,(ulong)local_28);
    if (*pvVar3 == 0) break;
    local_28 = local_28 + 1;
  }
  *in_RCX = 0;
  reconstructLineOffsets(_i_1,in_stack_0000001c,in_stack_00000010);
  return;
}

Assistant:

void
readLineOffsets (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is,
                 LineOrder lineOrder,
                 vector<Int64> &lineOffsets,
                 bool &complete)
{
    for (unsigned int i = 0; i < lineOffsets.size(); i++)
    {
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (is, lineOffsets[i]);
    }

    complete = true;

    for (unsigned int i = 0; i < lineOffsets.size(); i++)
    {
        if (lineOffsets[i] <= 0)
        {
            //
            // Invalid data in the line offset table mean that
            // the file is probably incomplete (the table is
            // the last thing written to the file).  Either
            // some process is still busy writing the file,
            // or writing the file was aborted.
            //
            // We should still be able to read the existing
            // parts of the file.  In order to do this, we
            // have to make a sequential scan over the scan
            // line data to reconstruct the line offset table.
            //

            complete = false;
            reconstructLineOffsets (is, lineOrder, lineOffsets);
            break;
        }
    }
}